

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

uint64_t __thiscall
nivalis::Environment::def_func
          (Environment *this,string *func_name,Expr *expr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *arg_bindings)

{
  int iVar1;
  pointer pUVar2;
  pointer puVar3;
  pointer puVar4;
  unsigned_long uVar5;
  bool bVar6;
  iterator iVar7;
  uint64_t fid;
  mapped_type_conflict1 *pmVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  long lVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ulong uVar11;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Expr func_expr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arg_vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->error_msg)._M_string_length = 0;
  *(this->error_msg)._M_dataplus._M_p = '\0';
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->freg)._M_t,func_name);
  if ((_Rb_tree_header *)iVar7._M_node == &(this->freg)._M_t._M_impl.super__Rb_tree_header) {
    fid = ((long)(this->funcs).
                 super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->funcs).
                super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x58;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->freg,func_name);
    *pmVar8 = fid;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::emplace_back<>(&this->funcs);
    std::__cxx11::string::_M_assign
              ((string *)
               ((this->funcs).
                super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
  }
  else {
    fid = *(uint64_t *)(iVar7._M_node + 2);
  }
  pUVar2 = (this->funcs).
           super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(pointer *)
            &pUVar2[fid].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl;
  if (*(pointer *)
       ((long)&pUVar2[fid].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl + 8) != puVar3) {
    *(pointer *)
     ((long)&pUVar2[fid].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl + 8) = puVar3;
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&func_expr.ast,&expr->ast);
  Expr::optimize(&func_expr,5);
  local_a0._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&arg_vars,
             (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict1 *)&local_a0,
             (allocator_type *)&local_50);
  this_00 = &pUVar2[fid].deps;
  puVar3 = (arg_bindings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (arg_bindings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (uVar11 = 0; uVar11 < (ulong)((long)puVar4 - (long)puVar3 >> 3); uVar11 = uVar11 + 1) {
    uVar5 = puVar3[uVar11];
    if (uVar5 != 0xffffffffffffffff) {
      arg_vars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = uVar11;
    }
  }
  lVar10 = 8;
  uVar11 = 0;
  do {
    if ((ulong)((long)func_expr.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)func_expr.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar11) {
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pUVar2[fid].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&pUVar2[fid].deps.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8));
      _Var9 = std::
              __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (pUVar2[fid].deps.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         *(pointer *)
                          ((long)&pUVar2[fid].deps.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl + 8));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (this_00,(long)_Var9._M_current -
                         (long)(this_00->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3);
      pUVar2[fid].n_args =
           (long)(arg_bindings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(arg_bindings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::_M_move_assign
                (&pUVar2[fid].expr.ast,&func_expr);
      bVar6 = anon_unknown_0::check_for_cycle(&this->funcs,fid);
      if (bVar6) {
        Expr::ASTNode::ASTNode((ASTNode *)&local_a0,null);
        std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
        _M_assign_aux<nivalis::Expr::ASTNode_const*>
                  ((vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)
                   &pUVar2[fid].expr,&local_a0,&local_a0.field_2);
        puVar3 = pUVar2[fid].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pUVar2[fid].deps.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
            != puVar3) {
          *(pointer *)
           ((long)&pUVar2[fid].deps.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               puVar3;
        }
        std::operator+(&local_50,"Cycle found in definition of ",func_name);
        std::operator+(&local_a0,&local_50,"(...)\n");
        std::__cxx11::string::operator=((string *)&this->error_msg,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_50);
        fid = 0xffffffffffffffff;
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&arg_vars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&func_expr);
      return fid;
    }
    iVar1 = *(int *)((long)func_expr.ast.
                           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
    if (iVar1 - 0x11U < 2) {
LAB_001c3883:
      uVar5 = arg_vars.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [*(long *)((long)&(func_expr.ast.
                                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar10)];
      if (uVar5 == 0xffffffffffffffff) {
        if (iVar1 == 0xc) goto LAB_001c38a9;
      }
      else {
        *(undefined4 *)
         ((long)func_expr.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar10 + -8) = 3;
        *(unsigned_long *)
         ((long)&(func_expr.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar10) = uVar5;
      }
    }
    else if (iVar1 == 0xc) {
LAB_001c38a9:
      local_a0._M_dataplus._M_p =
           (pointer)(ulong)*(uint *)((long)&(func_expr.ast.
                                             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->opcode +
                                    lVar10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (this_00,(unsigned_long *)&local_a0);
    }
    else if (iVar1 == 2) goto LAB_001c3883;
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

uint64_t Environment::def_func(const std::string& func_name,
                  const Expr& expr,
                  const std::vector<uint64_t>& arg_bindings) {
    error_msg.clear();
    size_t idx = 0;
    auto it = freg.find(func_name);
    if (it == freg.end()) {
        // New function
        idx = freg[func_name] = funcs.size();
        funcs.emplace_back();
        funcs.back().name = func_name;
    } else {
        idx = it->second;
    }
    UserFunction& func = funcs[idx];
    func.deps.clear();
    Expr func_expr = expr;
    func_expr.optimize(); // Optimize function expression
    auto& ast = func_expr.ast;
    // Invert argument mapping
    std::vector<uint64_t> arg_vars(vars.size(), -1);
    for (size_t i = 0; i < arg_bindings.size(); ++i) {
        if (~arg_bindings[i]) {
            arg_vars[arg_bindings[i]] = i;
        }
    }
    // Sub arguments
    for (size_t i = 0; i < ast.size(); ++i) {
        auto& nd = ast[i];
        if (OpCode::has_ref(nd.opcode) &&
            nd.opcode != OpCode::arg &&
            ~arg_vars[nd.ref]) {
            // Set argument
            nd.opcode = OpCode::arg;
            nd.ref = arg_vars[nd.ref];
        }
        if (nd.opcode == OpCode::call) {
            // Set dependency on other function
            func.deps.push_back(nd.call_info[0]);
        }
    }
    std::sort(func.deps.begin(), func.deps.end());
    func.deps.resize(std::unique(func.deps.begin(), func.deps.end()) - func.deps.begin());
    func.n_args = arg_bindings.size();
    func.expr = std::move(func_expr);

    // Check for recursion
    if (check_for_cycle(funcs, idx)) {
        // Found cycle
        func.expr.ast = { OpCode::null };
        func.deps.clear();
        error_msg = "Cycle found in definition of " + func_name + "(...)\n";
        return -1;
    }
    return idx;
}